

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::MergeFrom
          (ExtensionSet *this,MessageLite *extendee,ExtensionSet *other)

{
  uint16_t uVar1;
  int iVar2;
  KeyValue *pKVar3;
  ulong uVar4;
  uint uVar5;
  KeyValue *pKVar6;
  size_t minimum_new_capacity;
  KeyValue *pKVar7;
  int iVar8;
  KeyValue *pKVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  iterator iVar13;
  iterator iVar14;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  it_source;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  end_source;
  
  if (((this->flat_size_ == 0) && (this->flat_capacity_ == 0)) && (-1 < (short)other->flat_size_)) {
    InternalMergeFromSmallToEmpty(this,extendee,other);
    return;
  }
  minimum_new_capacity = (size_t)(short)this->flat_size_;
  if (-1 < (long)minimum_new_capacity) {
    uVar1 = other->flat_size_;
    pKVar9 = (this->map_).flat;
    pKVar6 = pKVar9 + minimum_new_capacity;
    pKVar7 = (other->map_).flat;
    if ((long)(short)uVar1 < 0) {
      iVar13 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
               ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                        *)pKVar7);
      iVar14 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
               ::end((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                      *)(other->map_).flat);
      it_source._12_4_ = 0;
      it_source.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            *)SUB128(iVar13._0_12_,0);
      it_source.position_ = SUB124(iVar13._0_12_,8);
      end_source._12_4_ = 0;
      end_source.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            *)SUB128(iVar14._0_12_,0);
      end_source.position_ = SUB124(iVar14._0_12_,8);
      minimum_new_capacity =
           (anonymous_namespace)::
           SizeOfUnion<google::protobuf::internal::ExtensionSet::KeyValue*,absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>>
                     (pKVar9,pKVar6,it_source,end_source);
    }
    else if (uVar1 != 0) {
      pKVar3 = pKVar7 + (short)uVar1;
      do {
        if (pKVar9 == pKVar6) {
LAB_00124ca6:
          uVar4 = (ulong)(((pKVar7->second).field_0xa & 2) == 0);
        }
        else {
          iVar2 = pKVar7->first;
          iVar8 = pKVar9->first;
          if (iVar8 < iVar2) {
            do {
              pKVar9 = pKVar9 + 1;
              bVar12 = pKVar9 == pKVar6;
              if (bVar12) goto LAB_00124ca6;
              iVar8 = pKVar9->first;
            } while (iVar8 < iVar2);
          }
          else {
            bVar12 = false;
          }
          if (!(bool)(~bVar12 & iVar8 <= iVar2)) goto LAB_00124ca6;
          uVar4 = 0;
        }
        minimum_new_capacity = minimum_new_capacity + uVar4;
        pKVar7 = pKVar7 + 1;
      } while (pKVar7 != pKVar3);
    }
    GrowCapacity(this,minimum_new_capacity);
  }
  lVar10 = (long)(short)other->flat_size_;
  pKVar9 = (other->map_).flat;
  if (lVar10 < 0) {
    iVar13 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                      *)pKVar9);
    iVar14 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                    *)(other->map_).flat);
    ForEachPrefetchImpl<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>,google::protobuf::internal::ExtensionSet::InternalMergeFromSlow(google::protobuf::MessageLite_const*,google::protobuf::internal::ExtensionSet_const&)::__0,google::protobuf::internal::ExtensionSet::Prefetch>
              (iVar13.node_,iVar13.position_,iVar14.node_,iVar14._8_8_ & 0xffffffff);
  }
  else {
    lVar11 = lVar10 * 0x20;
    pKVar7 = pKVar9 + lVar10;
    pKVar6 = pKVar9;
    if (other->flat_size_ != 0) {
      uVar5 = 0;
      do {
        lVar11 = lVar11 + -0x20;
        Extension::PrefetchPtr(&pKVar6->second);
        pKVar6 = pKVar6 + 1;
        if (lVar11 == 0) break;
        bVar12 = uVar5 < 0xf;
        uVar5 = uVar5 + 1;
      } while (bVar12);
    }
    for (; pKVar6 != pKVar7; pKVar6 = pKVar6 + 1) {
      InternalExtensionMergeFrom(this,extendee,pKVar9->first,&pKVar9->second,other->arena_);
      Extension::PrefetchPtr(&pKVar6->second);
      pKVar9 = pKVar9 + 1;
    }
    for (; pKVar9 != pKVar7; pKVar9 = pKVar9 + 1) {
      InternalExtensionMergeFrom(this,extendee,pKVar9->first,&pKVar9->second,other->arena_);
    }
  }
  return;
}

Assistant:

PROTOBUF_ALWAYS_INLINE void PrefetchLine(const void* ptr, size_t line) {
  static_assert(kOpts.from.unit == PrefetchOpts::kBytes);
  const ptrdiff_t offset = kOpts.from.num + (line * ABSL_CACHELINE_SIZE);
  // Pointer + offset overflows don't matter for prefetching, because the
  // prefetch instruction is just a no-op for invalid addresses (although
  // potentially incurring the cost of a TLB page-walk if there's no valid
  // mapping for the page - but that should be rare in practice). Still, to
  // formally avoid UB, we perform the arithmetic in uintptr_t space.
  const void* prefetch_ptr =
      reinterpret_cast<const void*>(reinterpret_cast<uintptr_t>(ptr) + offset);
  __builtin_prefetch(prefetch_ptr, kOpts.mem_op, kOpts.locality);
}